

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLAttribute::ParseDeep(XMLAttribute *this,char *p,bool processEntities)

{
  int iVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char endTag [2];
  byte local_2a [2];
  
  pbVar2 = (byte *)StrPair::ParseName(&this->_name,p);
  if ((pbVar2 != (byte *)0x0) && (bVar4 = *pbVar2, '\0' < (char)bVar4)) {
    while( true ) {
      pbVar2 = pbVar2 + 1;
      iVar1 = isspace((uint)bVar4);
      if (iVar1 == 0) break;
      bVar4 = *pbVar2;
      if ((char)bVar4 < '\0') {
        return (char *)0x0;
      }
    }
    if (bVar4 == 0x3d) {
      bVar4 = *pbVar2;
      while ((-1 < (char)bVar4 && (iVar1 = isspace((uint)bVar4), iVar1 != 0))) {
        bVar4 = pbVar2[1];
        pbVar2 = pbVar2 + 1;
      }
      if ((bVar4 == 0x27) || (bVar4 == 0x22)) {
        local_2a[1] = 0;
        local_2a[0] = bVar4;
        pcVar3 = StrPair::ParseText(&this->_value,(char *)(pbVar2 + 1),(char *)local_2a,
                                    processEntities | 2);
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char* XMLAttribute::ParseDeep( char* p, bool processEntities )
{
    // Parse using the name rules: bug fix, was using ParseText before
    p = _name.ParseName( p );
    if ( !p || !*p ) {
        return 0;
    }

    // Skip white space before =
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '=' ) {
        return 0;
    }

    ++p;	// move up to opening quote
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '\"' && *p != '\'' ) {
        return 0;
    }

    char endTag[2] = { *p, 0 };
    ++p;	// move past opening quote

    p = _value.ParseText( p, endTag, processEntities ? StrPair::ATTRIBUTE_VALUE : StrPair::ATTRIBUTE_VALUE_LEAVE_ENTITIES );
    return p;
}